

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigFree(Abc_Aig_t *pMan)

{
  Vec_Ptr_t *pVVar1;
  Vec_Vec_t *pVVar2;
  void *pvVar3;
  long lVar4;
  
  if (pMan->vStackReplaceOld->nSize != 0) {
    __assert_fail("Vec_PtrSize( pMan->vStackReplaceOld ) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0xa7,"void Abc_AigFree(Abc_Aig_t *)");
  }
  if (pMan->vStackReplaceNew->nSize == 0) {
    pVVar1 = pMan->vAddedCells;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar1 = pMan->vUpdatedNets;
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      if (pVVar1->pArray != (void **)0x0) {
        free(pVVar1->pArray);
        pVVar1->pArray = (void **)0x0;
      }
      free(pVVar1);
    }
    pVVar2 = pMan->vLevels;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar4];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    if (pVVar2 != (Vec_Vec_t *)0x0) {
      free(pVVar2);
    }
    pVVar2 = pMan->vLevelsR;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pvVar3 = pVVar2->pArray[lVar4];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
            *(undefined8 *)((long)pvVar3 + 8) = 0;
          }
          free(pvVar3);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar2->nSize);
    }
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    if (pVVar2 != (Vec_Vec_t *)0x0) {
      free(pVVar2);
    }
    pVVar1 = pMan->vStackReplaceOld;
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      free(pVVar1);
    }
    pVVar1 = pMan->vStackReplaceNew;
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      free(pVVar1);
    }
    pVVar1 = pMan->vNodes;
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      free(pVVar1);
    }
    if (pMan->pBins != (Abc_Obj_t **)0x0) {
      free(pMan->pBins);
      pMan->pBins = (Abc_Obj_t **)0x0;
    }
    if (pMan != (Abc_Aig_t *)0x0) {
      free(pMan);
      return;
    }
    return;
  }
  __assert_fail("Vec_PtrSize( pMan->vStackReplaceNew ) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0xa8,"void Abc_AigFree(Abc_Aig_t *)");
}

Assistant:

void Abc_AigFree( Abc_Aig_t * pMan )
{
    assert( Vec_PtrSize( pMan->vStackReplaceOld ) == 0 );
    assert( Vec_PtrSize( pMan->vStackReplaceNew ) == 0 );
    // free the table
    if ( pMan->vAddedCells )
        Vec_PtrFree( pMan->vAddedCells );
    if ( pMan->vUpdatedNets )
        Vec_PtrFree( pMan->vUpdatedNets );
    Vec_VecFree( pMan->vLevels );
    Vec_VecFree( pMan->vLevelsR );
    Vec_PtrFree( pMan->vStackReplaceOld );
    Vec_PtrFree( pMan->vStackReplaceNew );
    Vec_PtrFree( pMan->vNodes );
    ABC_FREE( pMan->pBins );
    ABC_FREE( pMan );
}